

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

void vfp_set_fpscr_to_host(CPUARMState_conflict *env,uint32_t val)

{
  uint uVar1;
  int val_00;
  bool bVar2;
  _Bool dnan_enabled;
  _Bool ftz_enabled_1;
  uint uStack_18;
  _Bool ftz_enabled;
  uint32_t changed;
  int i;
  uint32_t val_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = val ^ (env->vfp).xregs[1];
  if ((uVar1 & 0xc00000) != 0) {
    uStack_18 = val >> 0x16 & 3;
    switch(uStack_18) {
    case 0:
      uStack_18 = 0;
      break;
    case 1:
      uStack_18 = 2;
      break;
    case 2:
      uStack_18 = 1;
      break;
    case 3:
      uStack_18 = 3;
    }
    set_float_rounding_mode(uStack_18,&(env->vfp).fp_status);
    set_float_rounding_mode(uStack_18,&(env->vfp).fp_status_f16);
  }
  if ((uVar1 & 0x80000) != 0) {
    bVar2 = (val & 0x80000) != 0;
    set_flush_to_zero(bVar2,&(env->vfp).fp_status_f16);
    set_flush_inputs_to_zero(bVar2,&(env->vfp).fp_status_f16);
  }
  if ((uVar1 & 0x1000000) != 0) {
    bVar2 = (val & 0x1000000) != 0;
    set_flush_to_zero(bVar2,&(env->vfp).fp_status);
    set_flush_inputs_to_zero(bVar2,&(env->vfp).fp_status);
  }
  if ((uVar1 & 0x2000000) != 0) {
    bVar2 = (val & 0x2000000) != 0;
    set_default_nan_mode(bVar2,&(env->vfp).fp_status);
    set_default_nan_mode(bVar2,&(env->vfp).fp_status_f16);
  }
  val_00 = vfp_exceptbits_to_host(val);
  set_float_exception_flags(val_00,&(env->vfp).fp_status);
  set_float_exception_flags(0,&(env->vfp).fp_status_f16);
  set_float_exception_flags(0,&(env->vfp).standard_fp_status);
  return;
}

Assistant:

static void vfp_set_fpscr_to_host(CPUARMState *env, uint32_t val)
{
    int i;
    uint32_t changed = env->vfp.xregs[ARM_VFP_FPSCR];

    changed ^= val;
    if (changed & (3 << 22)) {
        i = (val >> 22) & 3;
        switch (i) {
        case FPROUNDING_TIEEVEN:
            i = float_round_nearest_even;
            break;
        case FPROUNDING_POSINF:
            i = float_round_up;
            break;
        case FPROUNDING_NEGINF:
            i = float_round_down;
            break;
        case FPROUNDING_ZERO:
            i = float_round_to_zero;
            break;
        }
        set_float_rounding_mode(i, &env->vfp.fp_status);
        set_float_rounding_mode(i, &env->vfp.fp_status_f16);
    }
    if (changed & FPCR_FZ16) {
        bool ftz_enabled = val & FPCR_FZ16;
        set_flush_to_zero(ftz_enabled, &env->vfp.fp_status_f16);
        set_flush_inputs_to_zero(ftz_enabled, &env->vfp.fp_status_f16);
    }
    if (changed & FPCR_FZ) {
        bool ftz_enabled = val & FPCR_FZ;
        set_flush_to_zero(ftz_enabled, &env->vfp.fp_status);
        set_flush_inputs_to_zero(ftz_enabled, &env->vfp.fp_status);
    }
    if (changed & FPCR_DN) {
        bool dnan_enabled = val & FPCR_DN;
        set_default_nan_mode(dnan_enabled, &env->vfp.fp_status);
        set_default_nan_mode(dnan_enabled, &env->vfp.fp_status_f16);
    }

    /*
     * The exception flags are ORed together when we read fpscr so we
     * only need to preserve the current state in one of our
     * float_status values.
     */
    i = vfp_exceptbits_to_host(val);
    set_float_exception_flags(i, &env->vfp.fp_status);
    set_float_exception_flags(0, &env->vfp.fp_status_f16);
    set_float_exception_flags(0, &env->vfp.standard_fp_status);
}